

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O1

LLVMValueRef CompileLlvmMemberAccess(LlvmCompilationContext *ctx,ExprMemberAccess *node)

{
  uint uVar1;
  LLVMValueRef pLVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  
  CompileLlvm(ctx,node->value);
  pp_Var3 = node->value->type[1]._vptr_TypeBase;
  if (((pp_Var3 == (_func_int **)0x0) || (0x19 < *(uint *)(pp_Var3 + 1))) ||
     ((0x3130000U >> (*(uint *)(pp_Var3 + 1) & 0x1f) & 1) == 0)) {
    pp_Var3 = (_func_int **)0x0;
  }
  uVar1 = 0;
  if (pp_Var3 != (_func_int **)0x0) {
    uVar1 = (uint)(*(int *)(pp_Var3 + 1) == 0x14);
  }
  p_Var4 = pp_Var3[0xd];
  if (p_Var4 != (_func_int *)0x0) {
    do {
      if (*(VariableData **)(p_Var4 + 8) == node->member->variable) goto LAB_0026c4cc;
      uVar1 = uVar1 + 1;
      p_Var4 = *(_func_int **)(p_Var4 + 0x18);
    } while (p_Var4 != (_func_int *)0x0);
    uVar1 = 0xffffffff;
LAB_0026c4cc:
    if (uVar1 != 0xffffffff) {
      pLVar2 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)&placeholderValue);
      return pLVar2;
    }
  }
  __assert_fail("memberIndex != ~0u",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x589,
                "LLVMValueRef CompileLlvmMemberAccess(LlvmCompilationContext &, ExprMemberAccess *)"
               );
}

Assistant:

LLVMValueRef CompileLlvmMemberAccess(LlvmCompilationContext &ctx, ExprMemberAccess *node)
{
	LLVMValueRef value = CompileLlvm(ctx, node->value);

	TypeRef *typeRef = getType<TypeRef>(node->value->type);
	TypeStruct *typeStruct = getType<TypeStruct>(typeRef->subType);

	unsigned memberIndex = ~0u;

	unsigned currMember = 0;

	// Unsized array types have a hidden member (pointer) at index 0
	if(isType<TypeUnsizedArray>(typeStruct))
		currMember++;

	for(MemberHandle *curr = typeStruct->members.head; curr; curr = curr->next)
	{
		if(curr->variable == node->member->variable)
		{
			memberIndex = currMember;
			break;
		}

		currMember++;
	}

	assert(memberIndex != ~0u);

	LLVMValueRef indices[] = { LLVMConstInt(LLVMInt32TypeInContext(ctx.context), 0, true), LLVMConstInt(LLVMInt32TypeInContext(ctx.context), memberIndex, true) };

	return CheckType(ctx, node, LLVMBuildGEP(ctx.builder, value, indices, 2, ""));
}